

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool cmCTest::ProgressOutputSupportedByConsole(void)

{
  bool bVar1;
  int iVar2;
  string sStack_30;
  
  sStack_30._M_string_length = 0;
  sStack_30.field_2._M_local_buf[0] = '\0';
  sStack_30._M_dataplus._M_p = (pointer)&sStack_30.field_2;
  bVar1 = cmsys::SystemTools::GetEnv("TERM",&sStack_30);
  if (bVar1) {
    iVar2 = isatty(1);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&sStack_30);
      bVar1 = iVar2 != 0;
      goto LAB_00541d49;
    }
  }
  bVar1 = false;
LAB_00541d49:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_30._M_dataplus._M_p != &sStack_30.field_2) {
    operator_delete(sStack_30._M_dataplus._M_p,
                    CONCAT71(sStack_30.field_2._M_allocated_capacity._1_7_,
                             sStack_30.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool cmCTest::ProgressOutputSupportedByConsole()
{
#if defined(_WIN32)
  // On Windows we need a console buffer.
  void* console = GetStdHandle(STD_OUTPUT_HANDLE);
  CONSOLE_SCREEN_BUFFER_INFO csbi;
  return GetConsoleScreenBufferInfo(console, &csbi);
#else
  // On UNIX we need a non-dumb tty.
  return ConsoleIsNotDumb();
#endif
}